

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall GlobOpt::PRE::PreloadPRECandidates(PRE *this,Loop *loop)

{
  BasicBlock *pBVar1;
  BasicBlock *pBVar2;
  Type this_00;
  code *pcVar3;
  SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount> *buffer;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar7;
  Type *ppHVar8;
  JITTimeFunctionBody *this_01;
  FunctionJITTimeInfo *this_02;
  long lVar9;
  Func **ppFVar10;
  undefined1 local_50 [8];
  EditingIterator iter;
  
  if ((this->candidates != (PRECandidates *)0x0) &&
     (this->candidates->candidatesList != (PRECandidatesList *)0x0)) {
    pBVar1 = loop->landingPad;
    pBVar2 = pBVar1->next;
    ppFVar10 = (Func **)&pBVar2->firstInstr;
    if (pBVar2 == (BasicBlock *)0x0) {
      ppFVar10 = &pBVar1->func;
    }
    lVar9 = 0x18;
    if (pBVar2 == (BasicBlock *)0x0) {
      lVar9 = 0xd0;
    }
    iter.super_EditingIterator.last = (NodeBase *)loop;
    if (pBVar1->firstInstr != *(Instr **)((long)&(*ppFVar10)->m_alloc + lVar9)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x475,
                         "(loop->landingPad->GetFirstInstr() == loop->landingPad->GetLastInstr())",
                         "loop->landingPad->GetFirstInstr() == loop->landingPad->GetLastInstr()");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    do {
      local_50 = (undefined1  [8])this->candidates->candidatesList;
      iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
      iter.super_EditingIterator.super_Iterator.list =
           (SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount> *)local_50;
      bVar4 = SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount>::
              EditingIterator::Next((EditingIterator *)local_50);
      if (!bVar4) {
        return;
      }
      bVar4 = false;
      do {
        ppHVar8 = SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount>::
                  Iterator::Data((Iterator *)local_50);
        BVar6 = PreloadPRECandidate(this,(Loop *)iter.super_EditingIterator.last,*ppHVar8);
        buffer = iter.super_EditingIterator.super_Iterator.list;
        if (BVar6 != 0) {
          this_00 = *(Type *)((long)local_50 + 0x10);
          SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount>::
          EditingIterator::UnlinkCurrentNode((EditingIterator *)local_50);
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,
                     buffer,0x10);
          bVar4 = true;
        }
        this_01 = JITTimeWorkItem::GetJITFunctionBody(this->globOpt->func->m_workItem);
        sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_01);
        this_02 = JITTimeWorkItem::GetJITTimeInfo(this->globOpt->func->m_workItem);
        functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
        bVar5 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015b6718,FieldPREPhase,sourceContextId,functionId);
        if (bVar5) {
          Output::Print(L"============================\n");
          Output::Flush();
        }
        bVar5 = SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount>::
                EditingIterator::Next((EditingIterator *)local_50);
      } while (bVar5);
    } while (bVar4);
  }
  return;
}

Assistant:

void GlobOpt::PRE::PreloadPRECandidates(Loop *loop)
{
    // Insert loads in landing pad for field PRE candidates. Iterate while(changed)
    // for the o.x.y cases.
    BOOL changed = true;

    if (!candidates || !candidates->candidatesList)
    {
        return;
    }

    Assert(loop->landingPad->GetFirstInstr() == loop->landingPad->GetLastInstr());

    while (changed)
    {
        changed = false;
        FOREACH_SLIST_ENTRY_EDITING(GlobHashBucket*, candidate, (SList<GlobHashBucket*>*)candidates->candidatesList, iter)
        {
            if (this->PreloadPRECandidate(loop, candidate))
            {
                changed = true;
                iter.RemoveCurrent();
            }
            if (PHASE_TRACE(Js::FieldPREPhase, this->globOpt->func))
            {
                Output::Print(_u("============================\n"));
                Output::Flush();
            }
        } NEXT_SLIST_ENTRY_EDITING;
    }
}